

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

bool slang::ast::checkSignaturesMatch(SubroutineSymbol *a,SubroutineSymbol *b)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  Type *pTVar5;
  Type *pTVar6;
  long lVar7;
  ArgList AVar8;
  ArgList AVar9;
  
  if ((a->subroutineKind == b->subroutineKind) && ((a->flags).m_bits == (b->flags).m_bits)) {
    pTVar5 = DeclaredType::getType(&a->declaredReturnType);
    pTVar6 = DeclaredType::getType(&b->declaredReturnType);
    bVar3 = Type::isEquivalent(pTVar5,pTVar6);
    if (bVar3) {
      AVar8 = SubroutineSymbol::getArguments(a);
      AVar9 = SubroutineSymbol::getArguments(b);
      if (AVar8._M_extent._M_extent_value._M_extent_value ==
          AVar9._M_extent._M_extent_value._M_extent_value) {
        lVar7 = 0;
        while( true ) {
          bVar3 = AVar8._M_extent._M_extent_value._M_extent_value << 3 == lVar7;
          if (bVar3) {
            return bVar3;
          }
          lVar1 = *(long *)((long)AVar8._M_ptr + lVar7);
          lVar2 = *(long *)((long)AVar9._M_ptr + lVar7);
          pTVar5 = DeclaredType::getType((DeclaredType *)(lVar1 + 0x40));
          pTVar6 = DeclaredType::getType((DeclaredType *)(lVar2 + 0x40));
          bVar4 = Type::isEquivalent(pTVar5,pTVar6);
          if (!bVar4) break;
          if (*(int *)(lVar1 + 0x158) != *(int *)(lVar2 + 0x158)) {
            return bVar3;
          }
          lVar7 = lVar7 + 8;
        }
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

static bool checkSignaturesMatch(const SubroutineSymbol& a, const SubroutineSymbol& b) {
    if (a.subroutineKind != b.subroutineKind || a.flags != b.flags)
        return false;

    if (!a.getReturnType().isEquivalent(b.getReturnType()))
        return false;

    auto aargs = a.getArguments();
    auto bargs = b.getArguments();
    if (aargs.size() != bargs.size())
        return false;

    for (auto ai = aargs.begin(), bi = bargs.begin(); ai != aargs.end(); ai++, bi++) {
        auto aa = *ai;
        auto bb = *bi;
        if (!aa->getType().isEquivalent(bb->getType()))
            return false;
        if (aa->direction != bb->direction)
            return false;
    }

    return true;
}